

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O3

QVector<int> * __thiscall
KDReports::TableBreakingLogic::columnsPerPage
          (QVector<int> *__return_storage_ptr__,TableBreakingLogic *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  reference piVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar1 = this->m_pages;
  if ((long)iVar1 != 0) {
    uVar8 = (uint)(this->m_widths).d.size;
    if ((int)uVar8 < 1) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = 0.0;
      uVar6 = 0;
      do {
        dVar2 = dVar2 + (this->m_widths).d.ptr[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar6);
    }
    QList<int>::resize(__return_storage_ptr__,(long)iVar1);
    if ((int)uVar8 < 1) {
      iVar7 = 0;
    }
    else {
      dVar11 = 0.0;
      iVar9 = 0;
      iVar7 = 0;
      iVar10 = 0;
      do {
        if ((ulong)(this->m_widths).d.size <= (ulong)(long)iVar9) {
          columnsPerPage();
          QArrayDataPointer<int>::~QArrayDataPointer(&__return_storage_ptr__->d);
          _Unwind_Resume(extraout_RAX);
        }
        dVar3 = (this->m_widths).d.ptr[iVar9] + dVar11;
        if ((dVar3 <= dVar2 / (double)iVar1) || (iVar7 == this->m_pages + -1)) {
          iVar10 = iVar10 + 1;
          dVar11 = dVar3;
        }
        else {
          piVar5 = QList<int>::operator[](__return_storage_ptr__,(long)iVar7);
          bVar4 = dVar11 == 0.0 || dVar3 < ((dVar2 / (double)iVar1) * 4.0) / 3.0;
          iVar9 = iVar9 - ((byte)~-bVar4 & 1);
          iVar7 = iVar7 + 1;
          *piVar5 = iVar10 + (uint)bVar4;
          iVar10 = 0;
          dVar11 = 0.0;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)uVar8);
      if (iVar7 < this->m_pages && 0 < iVar10) {
        piVar5 = QList<int>::operator[](__return_storage_ptr__,(long)iVar7);
        iVar7 = iVar7 + 1;
        *piVar5 = iVar10;
      }
    }
    QList<int>::resize(__return_storage_ptr__,(long)iVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

QVector<int> TableBreakingLogic::columnsPerPage() const
{
    QVector<int> columnsForPage;
    if (m_pages == 0)
        return columnsForPage;
    const int numColumnsForPage = m_widths.count();
    qreal totalWidth = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        totalWidth += m_widths[i];
    }
    const qreal idealPageWidth = totalWidth / m_pages;
    // qDebug() << "idealPageWidth=" << idealPageWidth;
    qreal currentWidth = 0;
    columnsForPage.resize(m_pages);
    int columnsInThisPage = 0;
    int pageNumber = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        const qreal columnWidth = m_widths[i];
        const bool lastPage = pageNumber == m_pages - 1;
        if (currentWidth + columnWidth > idealPageWidth && !lastPage) {
            // Better to include or exclude the column?
            // That's the tricky part. If we exclude too much
            // the last page will be crammed, while if we include
            // a huge column this one might be crammed.
            // Let's have a threshold then: include it if we won't go over-board
            // more than 1/3rd of the page width.
            if (currentWidth + columnWidth < idealPageWidth * 4 / 3 || currentWidth == 0) { // Avoid infinite loop if huge column
                columnsInThisPage += 1;
            } else {
                // current column will be for next page.
                --i;
            }
            columnsForPage[pageNumber++] = columnsInThisPage;

            currentWidth = 0;
            columnsInThisPage = 0;
        } else {
            currentWidth += columnWidth;
            columnsInThisPage += 1;
        }
    }
    if (pageNumber < m_pages && columnsInThisPage > 0) {
        columnsForPage[pageNumber++] = columnsInThisPage;
    }
    columnsForPage.resize(pageNumber);
#ifdef DEBUG_TABLEBREAKINGLOGIC
    qDebug() << "Result of optimized table breaking:" << columnsForPage;
#endif
    return columnsForPage;
}